

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::ValueRef::merge(ValueRef *this,ValueRef *other)

{
  SymbolKind SVar1;
  VarScope *pVVar2;
  bool bVar3;
  NodeEqualChecker local_9;
  
  this->assigned = (bool)(this->assigned & other->assigned);
  pVVar2 = other->lastAssigneeScope;
  if ((this->lastAssigneeScope == (VarScope *)0x0) ||
     ((pVVar2 != (VarScope *)0x0 && (this->lastAssigneeScope->depth < pVVar2->depth)))) {
    this->lastAssigneeScope = pVVar2;
  }
  SVar1 = this->info->kind;
  if (this->state == other->state) {
    if (SVar1 != SK_VAR) {
      return;
    }
    bVar3 = NodeEqualChecker::check
                      (&local_9,&this->expression->super_Node,&other->expression->super_Node);
    if (bVar3) {
      return;
    }
    if (this->info->kind != SK_VAR) goto LAB_0014e605;
    this->state = VRS_MULTIPLE;
  }
  else {
    if (SVar1 != SK_VAR) goto LAB_0014e605;
    this->state = *(ValueRefState *)
                   (mergeMatrix + (ulong)this->state * 4 + (ulong)other->state * 0x1c);
  }
  this->expression = (Expr *)0x0;
LAB_0014e605:
  this->flagsPositive = 0;
  this->flagsNegative = 0;
  (this->upperBound).kind = VBK_UNKNOWN;
  (this->lowerBound).kind = VBK_UNKNOWN;
  return;
}

Assistant:

void ValueRef::merge(const ValueRef *other) {

  assert(info == other->info);

  assigned &= other->assigned;
  if (lastAssigneeScope) {
    if (other->lastAssigneeScope && other->lastAssigneeScope->depth > lastAssigneeScope->depth)
      lastAssigneeScope = other->lastAssigneeScope;
  }
  else
  {
    lastAssigneeScope = other->lastAssigneeScope;
  }

  if (state != other->state) {
    enum ValueRefState k = mergeMatrix[other->state][state];
    kill(k);
    return;
  }

  if (isConstant()) {
    assert(other->isConstant());
    return;
  }

  if (!NodeEqualChecker().check(expression, other->expression)) {
    kill(VRS_MULTIPLE);
  }
}